

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O1

void Parser::MapBindIdentifier<AddArgsToScope(ParseNodeFnc*,ByteCodeGenerator*,bool)::__0>
               (ParseNodePtr patternNode,anon_class_32_4_343c1aa9 handler)

{
  ParseNode *pPVar1;
  code *pcVar2;
  bool bVar3;
  ParseNodeBin *pPVar4;
  undefined4 *puVar5;
  ParseNodeArrLit *pPVar6;
  ParseNodeUni *pPVar7;
  ParseNodePtr *ppPVar8;
  ParseNodePtr *ppPVar9;
  ParseNodePtr elementNode;
  ParseNodePtr local_38;
  
  if (patternNode->nop == knopAsg) {
    pPVar4 = ParseNode::AsParseNodeBin(patternNode);
    patternNode = pPVar4->pnode1;
  }
  if ((patternNode->nop & ~knopInt) != knopObjectPattern) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                       ,0x2e8,"(patternNode->IsPattern())","patternNode->IsPattern()");
    if (!bVar3) {
LAB_008396fb:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (patternNode->nop == knopArrayPattern) {
    pPVar6 = ParseNode::AsParseNodeArrLit(patternNode);
    ppPVar9 = &local_38;
    local_38 = (pPVar6->super_ParseNodeUni).pnode1;
    do {
      pPVar1 = *ppPVar9;
      if (pPVar1 == (ParseNode *)0x0) {
        return;
      }
      if (pPVar1->nop == knopList) {
        pPVar4 = ParseNode::AsParseNodeBin(pPVar1);
        MapBindIdentifierFromElement<AddArgsToScope(ParseNodeFnc*,ByteCodeGenerator*,bool)::__0>
                  (pPVar4->pnode1,handler);
        pPVar4 = ParseNode::AsParseNodeBin(*ppPVar9);
        ppPVar9 = &pPVar4->pnode2;
      }
      else {
        MapBindIdentifierFromElement<AddArgsToScope(ParseNodeFnc*,ByteCodeGenerator*,bool)::__0>
                  (*ppPVar9,handler);
        ppPVar9 = (ParseNodePtr *)0x0;
      }
    } while (ppPVar9 != (ParseNodePtr *)0x0);
  }
  else {
    pPVar7 = ParseNode::AsParseNodeUni(patternNode);
    local_38 = pPVar7->pnode1;
    ppPVar9 = &local_38;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      pPVar1 = *ppPVar9;
      if (pPVar1 == (ParseNode *)0x0) {
        return;
      }
      if (pPVar1->nop == knopList) {
        pPVar4 = ParseNode::AsParseNodeBin(pPVar1);
        pPVar1 = pPVar4->pnode1;
        if ((pPVar1->nop != knopEllipsis) && (pPVar1->nop != knopObjectPatternMember)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                             ,0x2f2,
                             "(item->nop == knopObjectPatternMember || item->nop == knopEllipsis)",
                             "item->nop == knopObjectPatternMember || item->nop == knopEllipsis");
          if (!bVar3) goto LAB_008396fb;
          *puVar5 = 0;
        }
        if (pPVar1->nop == knopObjectPatternMember) {
          pPVar4 = ParseNode::AsParseNodeBin(pPVar1);
          ppPVar8 = &pPVar4->pnode2;
        }
        else {
          pPVar7 = ParseNode::AsParseNodeUni(pPVar1);
          ppPVar8 = &pPVar7->pnode1;
        }
        MapBindIdentifierFromElement<AddArgsToScope(ParseNodeFnc*,ByteCodeGenerator*,bool)::__0>
                  (*ppPVar8,handler);
        pPVar4 = ParseNode::AsParseNodeBin(*ppPVar9);
        ppPVar9 = &pPVar4->pnode2;
      }
      else {
        pPVar1 = *ppPVar9;
        if ((pPVar1->nop != knopEllipsis) && (pPVar1->nop != knopObjectPatternMember)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                             ,0x2f2,
                             "(item->nop == knopObjectPatternMember || item->nop == knopEllipsis)",
                             "item->nop == knopObjectPatternMember || item->nop == knopEllipsis");
          if (!bVar3) goto LAB_008396fb;
          *puVar5 = 0;
        }
        if (pPVar1->nop == knopObjectPatternMember) {
          pPVar4 = ParseNode::AsParseNodeBin(pPVar1);
          elementNode = pPVar4->pnode2;
        }
        else {
          pPVar7 = ParseNode::AsParseNodeUni(pPVar1);
          elementNode = pPVar7->pnode1;
        }
        MapBindIdentifierFromElement<AddArgsToScope(ParseNodeFnc*,ByteCodeGenerator*,bool)::__0>
                  (elementNode,handler);
        ppPVar9 = (ParseNodePtr *)0x0;
      }
    } while (ppPVar9 != (ParseNodePtr *)0x0);
  }
  return;
}

Assistant:

static void MapBindIdentifier(ParseNodePtr patternNode, THandler handler)
    {
        if (patternNode->nop == knopAsg)
        {
            patternNode = patternNode->AsParseNodeBin()->pnode1;
        }

        Assert(patternNode->IsPattern());
        if (patternNode->nop == knopArrayPattern)
        {
            ForEachItemInList(patternNode->AsParseNodeArrLit()->pnode1, [&](ParseNodePtr item) {
                MapBindIdentifierFromElement(item, handler);
            });
        }
        else
        {
            ForEachItemInList(patternNode->AsParseNodeUni()->pnode1, [&](ParseNodePtr item) {
                Assert(item->nop == knopObjectPatternMember || item->nop == knopEllipsis);
                if (item->nop == knopObjectPatternMember)
                {
                    MapBindIdentifierFromElement(item->AsParseNodeBin()->pnode2, handler);
                }
                else
                {
                    MapBindIdentifierFromElement(item->AsParseNodeUni()->pnode1, handler);
                }
            });
        }
    }